

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CTableFunctionBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  CTableFunctionInfo *pCVar1;
  _Head_base<0UL,_duckdb::CTableBindData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  BinderException *this_00;
  pointer *__ptr;
  templated_unique_single_t result;
  CTableInternalBindInfo bind_info;
  _Head_base<0UL,_duckdb::CTableBindData_*,_false> local_98;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_90;
  ClientContext *local_88;
  TableFunctionBindInput *local_80;
  vector<duckdb::LogicalType,_true> *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_70;
  type local_68;
  CTableFunctionInfo *local_60;
  char local_58;
  string local_50;
  
  local_90._M_head_impl = (FunctionData *)this;
  optional_ptr<duckdb::TableFunctionInfo,_true>::CheckValid(&input->info);
  pCVar1 = (CTableFunctionInfo *)(input->info).ptr;
  local_98._M_head_impl = (CTableBindData *)operator_new(0x40);
  ((local_98._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_98._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_98._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_98._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__CTableBindData_024aa848;
  (local_98._M_head_impl)->info = pCVar1;
  (local_98._M_head_impl)->bind_data = (void *)0x0;
  (local_98._M_head_impl)->delete_callback = (duckdb_delete_callback_t)0x0;
  ((local_98._M_head_impl)->stats).
  super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_> =
       (_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)0x0
  ;
  local_68 = unique_ptr<duckdb::CTableBindData,_std::default_delete<duckdb::CTableBindData>,_true>::
             operator*((unique_ptr<duckdb::CTableBindData,_std::default_delete<duckdb::CTableBindData>,_true>
                        *)&local_98);
  local_58 = '\x01';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_88 = context;
  local_80 = input;
  local_78 = return_types;
  local_70 = names;
  local_60 = pCVar1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  (*pCVar1->bind)((duckdb_bind_info)&local_88);
  _Var3._M_head_impl = local_90._M_head_impl;
  _Var2._M_head_impl = local_98._M_head_impl;
  if (local_58 != '\0') {
    local_98._M_head_impl = (CTableBindData *)0x0;
    (local_90._M_head_impl)->_vptr_FunctionData = (_func_int **)_Var2._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_98._M_head_impl != (CTableBindData *)0x0) {
      (*((local_98._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           _Var3._M_head_impl;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this_00,&local_50);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> CTableFunctionBind(ClientContext &context, TableFunctionBindInput &input,
                                            vector<LogicalType> &return_types, vector<string> &names) {
	auto &info = input.info->Cast<CTableFunctionInfo>();
	D_ASSERT(info.bind && info.function && info.init);
	auto result = make_uniq<CTableBindData>(info);
	CTableInternalBindInfo bind_info(context, input, return_types, names, *result, info);
	info.bind(ToCBindInfo(bind_info));
	if (!bind_info.success) {
		throw BinderException(bind_info.error);
	}

	return std::move(result);
}